

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WindowCodeInit(Parse *pParse,Window *pMWin)

{
  long lVar1;
  Vdbe *p_00;
  KeyInfo *pP4;
  int iVar2;
  KeyInfo *pKeyInfo;
  ExprList *pList;
  FuncDef *p;
  int nExpr;
  Vdbe *v;
  Window *pWin;
  Window *pMWin_local;
  Parse *pParse_local;
  
  p_00 = sqlite3GetVdbe(pParse);
  if (pMWin->pPartition != (ExprList *)0x0) {
    iVar2 = pMWin->pPartition->nExpr;
    pMWin->regPart = pParse->nMem + 1;
    pParse->nMem = iVar2 + pParse->nMem;
    sqlite3VdbeAddOp3(p_00,0x49,0,pMWin->regPart,pMWin->regPart + iVar2 + -1);
  }
  iVar2 = pParse->nMem + 1;
  pParse->nMem = iVar2;
  pMWin->regOne = iVar2;
  sqlite3VdbeAddOp2(p_00,0x46,1,pMWin->regOne);
  v = (Vdbe *)pMWin;
  if (pMWin->eExclude == '\0') {
    for (; v != (Vdbe *)0x0; v = *(Vdbe **)&v->rc) {
      lVar1 = v->iCurrentTime;
      if (((*(uint *)(lVar1 + 4) & 0x1000) == 0) || (*(char *)((long)&v->nVar + 1) == 'W')) {
        if ((*(char **)(lVar1 + 0x38) == "nth_value") || (*(char **)(lVar1 + 0x38) == "first_value")
           ) {
          *(int *)&v->nStmtDefImmCons = pParse->nMem + 1;
          iVar2 = pParse->nTab;
          pParse->nTab = iVar2 + 1;
          *(int *)((long)&v->nStmtDefCons + 4) = iVar2;
          pParse->nMem = pParse->nMem + 2;
          sqlite3VdbeAddOp2(p_00,0x6f,*(int *)((long)&v->nStmtDefCons + 4),pMWin->iEphCsr);
        }
        else if ((*(char **)(lVar1 + 0x38) == "lead") || (*(char **)(lVar1 + 0x38) == "lag")) {
          iVar2 = pParse->nTab;
          pParse->nTab = iVar2 + 1;
          *(int *)((long)&v->nStmtDefCons + 4) = iVar2;
          sqlite3VdbeAddOp2(p_00,0x6f,*(int *)((long)&v->nStmtDefCons + 4),pMWin->iEphCsr);
        }
      }
      else {
        pP4 = sqlite3KeyInfoFromExprList(pParse,*(ExprList **)&v->aMem->szMalloc,0,0);
        iVar2 = pParse->nTab;
        pParse->nTab = iVar2 + 1;
        *(int *)((long)&v->nStmtDefCons + 4) = iVar2;
        *(int *)&v->nStmtDefImmCons = pParse->nMem + 1;
        pParse->nMem = pParse->nMem + 3;
        if ((pP4 != (KeyInfo *)0x0) && (*(char *)(*(long *)(v->iCurrentTime + 0x38) + 1) == 'i')) {
          *pP4->aSortOrder = '\x01';
        }
        sqlite3VdbeAddOp2(p_00,0x71,*(int *)((long)&v->nStmtDefCons + 4),2);
        sqlite3VdbeAppendP4(p_00,pP4,-9);
        sqlite3VdbeAddOp2(p_00,0x46,0,(int)v->nStmtDefImmCons + 1);
      }
    }
  }
  else {
    iVar2 = pParse->nMem + 1;
    pParse->nMem = iVar2;
    pMWin->regStartRowid = iVar2;
    iVar2 = pParse->nMem + 1;
    pParse->nMem = iVar2;
    pMWin->regEndRowid = iVar2;
    iVar2 = pParse->nTab;
    pParse->nTab = iVar2 + 1;
    pMWin->csrApp = iVar2;
    sqlite3VdbeAddOp2(p_00,0x46,1,pMWin->regStartRowid);
    sqlite3VdbeAddOp2(p_00,0x46,0,pMWin->regEndRowid);
    sqlite3VdbeAddOp2(p_00,0x6f,pMWin->csrApp,pMWin->iEphCsr);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowCodeInit(Parse *pParse, Window *pMWin){
  Window *pWin;
  Vdbe *v = sqlite3GetVdbe(pParse);

  /* Allocate registers to use for PARTITION BY values, if any. Initialize
  ** said registers to NULL.  */
  if( pMWin->pPartition ){
    int nExpr = pMWin->pPartition->nExpr;
    pMWin->regPart = pParse->nMem+1;
    pParse->nMem += nExpr;
    sqlite3VdbeAddOp3(v, OP_Null, 0, pMWin->regPart, pMWin->regPart+nExpr-1);
  }

  pMWin->regOne = ++pParse->nMem;
  sqlite3VdbeAddOp2(v, OP_Integer, 1, pMWin->regOne);

  if( pMWin->eExclude ){
    pMWin->regStartRowid = ++pParse->nMem;
    pMWin->regEndRowid = ++pParse->nMem;
    pMWin->csrApp = pParse->nTab++;
    sqlite3VdbeAddOp2(v, OP_Integer, 1, pMWin->regStartRowid);
    sqlite3VdbeAddOp2(v, OP_Integer, 0, pMWin->regEndRowid);
    sqlite3VdbeAddOp2(v, OP_OpenDup, pMWin->csrApp, pMWin->iEphCsr);
    return;
  }

  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *p = pWin->pFunc;
    if( (p->funcFlags & SQLITE_FUNC_MINMAX) && pWin->eStart!=TK_UNBOUNDED ){
      /* The inline versions of min() and max() require a single ephemeral
      ** table and 3 registers. The registers are used as follows:
      **
      **   regApp+0: slot to copy min()/max() argument to for MakeRecord
      **   regApp+1: integer value used to ensure keys are unique
      **   regApp+2: output of MakeRecord
      */
      ExprList *pList = pWin->pOwner->x.pList;
      KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pList, 0, 0);
      pWin->csrApp = pParse->nTab++;
      pWin->regApp = pParse->nMem+1;
      pParse->nMem += 3;
      if( pKeyInfo && pWin->pFunc->zName[1]=='i' ){
        assert( pKeyInfo->aSortOrder[0]==0 );
        pKeyInfo->aSortOrder[0] = 1;
      }
      sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pWin->csrApp, 2);
      sqlite3VdbeAppendP4(v, pKeyInfo, P4_KEYINFO);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, pWin->regApp+1);
    }
    else if( p->zName==nth_valueName || p->zName==first_valueName ){
      /* Allocate two registers at pWin->regApp. These will be used to
      ** store the start and end index of the current frame.  */
      pWin->regApp = pParse->nMem+1;
      pWin->csrApp = pParse->nTab++;
      pParse->nMem += 2;
      sqlite3VdbeAddOp2(v, OP_OpenDup, pWin->csrApp, pMWin->iEphCsr);
    }
    else if( p->zName==leadName || p->zName==lagName ){
      pWin->csrApp = pParse->nTab++;
      sqlite3VdbeAddOp2(v, OP_OpenDup, pWin->csrApp, pMWin->iEphCsr);
    }
  }
}